

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O3

Fl_Type * write_code(Fl_Type *p)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  Fl_Type *pFVar4;
  undefined4 extraout_var_00;
  
  if (write_sourceview != 0) {
    lVar3 = ftell((FILE *)code_file);
    p->code_position = (int)lVar3;
    if (p->header_position_end == -1) {
      lVar3 = ftell((FILE *)header_file);
      p->header_position = (int)lVar3;
    }
  }
  if ((Fl_Type::last != p) || (iVar2 = (*p->_vptr_Fl_Type[0x25])(p), iVar2 == 0)) {
    (*p->_vptr_Fl_Type[0x11])(p);
  }
  iVar2 = (*p->_vptr_Fl_Type[0x17])(p);
  if ((iVar2 == 0) || (iVar2 = (*p->_vptr_Fl_Type[0x26])(p), iVar2 == 0)) {
    for (pFVar4 = p->next; pFVar4 != (Fl_Type *)0x0; pFVar4 = write_code(pFVar4)) {
      if (pFVar4->level <= p->level) goto LAB_001942be;
    }
    pFVar4 = (Fl_Type *)0x0;
LAB_001942be:
    (*p->_vptr_Fl_Type[0x12])(p);
  }
  else {
    pFVar4 = p->next;
    if (pFVar4 != (Fl_Type *)0x0) {
      while (p->level < pFVar4->level) {
        iVar2 = (*pFVar4->_vptr_Fl_Type[5])(pFVar4);
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"Function");
        if (iVar2 == 0) {
          piVar1 = &pFVar4->level;
          do {
            pFVar4 = pFVar4->next;
            if (pFVar4 == (Fl_Type *)0x0) goto LAB_00194216;
          } while (*piVar1 < pFVar4->level);
        }
        else {
          pFVar4 = write_code(pFVar4);
        }
        if (pFVar4 == (Fl_Type *)0x0) break;
      }
    }
LAB_00194216:
    (*p->_vptr_Fl_Type[0x12])(p);
    pFVar4 = p->next;
    while (pFVar4 != (Fl_Type *)0x0) {
      if (pFVar4->level <= p->level) goto LAB_0019427b;
      iVar2 = (*pFVar4->_vptr_Fl_Type[5])(pFVar4);
      iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"Function");
      if (iVar2 == 0) {
        pFVar4 = write_code(pFVar4);
      }
      else {
        piVar1 = &pFVar4->level;
        do {
          pFVar4 = pFVar4->next;
          if (pFVar4 == (Fl_Type *)0x0) goto LAB_00194278;
        } while (*piVar1 < pFVar4->level);
      }
    }
LAB_00194278:
    pFVar4 = (Fl_Type *)0x0;
LAB_0019427b:
    write_h("};\n");
    current_widget_class = (Fl_Widget_Class_Type *)0x0;
  }
  if (write_sourceview != 0) {
    lVar3 = ftell((FILE *)code_file);
    p->code_position_end = (int)lVar3;
    if (p->header_position_end == -1) {
      lVar3 = ftell((FILE *)header_file);
      p->header_position_end = (int)lVar3;
    }
  }
  return pFVar4;
}

Assistant:

static Fl_Type* write_code(Fl_Type* p) {
  if (write_sourceview) {
    p->code_position = (int)ftell(code_file);
    if (p->header_position_end==-1)
      p->header_position = (int)ftell(header_file);
  }
  // write all code that come before the children code
  // (but don't write the last comment until the very end)
  if (!(p==Fl_Type::last && p->is_comment()))
    p->write_code1();
  // recursively write the code of all children
  Fl_Type* q;
  if (p->is_widget() && p->is_class()) {
    // Handle widget classes specially
    for (q = p->next; q && q->level > p->level;) {
      if (strcmp(q->type_name(), "Function")) q = write_code(q);
      else {
        int level = q->level;
	do {
	  q = q->next;
	} while (q && q->level > level);
      }
    }

    // write all code that come after the children 
    p->write_code2();

    for (q = p->next; q && q->level > p->level;) {
      if (!strcmp(q->type_name(), "Function")) q = write_code(q);
      else {
        int level = q->level;
	do {
	  q = q->next;
	} while (q && q->level > level);
      }
    }

    write_h("};\n");
    current_widget_class = 0L;
  } else {
    for (q = p->next; q && q->level > p->level;) q = write_code(q);
    // write all code that come after the children 
    p->write_code2();
  }
  if (write_sourceview) {
    p->code_position_end = (int)ftell(code_file);
    if (p->header_position_end==-1)
      p->header_position_end = (int)ftell(header_file);
  }
  return q;
}